

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Type __thiscall wabt::LocalTypes::operator[](LocalTypes *this,Index i)

{
  bool bVar1;
  reference ppVar2;
  Type local_40;
  uint uStack_3c;
  pair<wabt::Type,_unsigned_int> decl;
  const_iterator __end1;
  const_iterator __begin1;
  Decls *__range1;
  Index count;
  Index i_local;
  LocalTypes *this_local;
  
  __range1._0_4_ = 0;
  __end1 = std::
           vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ::begin(&this->decls_);
  decl = (pair<wabt::Type,_unsigned_int>)
         std::
         vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
         ::end(&this->decls_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                                *)&decl);
    if (!bVar1) {
      if (i < (uint)__range1) {
        return Any;
      }
      __assert_fail("i < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.cc"
                    ,0xc1,"Type wabt::LocalTypes::operator[](Index) const");
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
             ::operator*(&__end1);
    uStack_3c = (*ppVar2).second;
    if (i < (uint)__range1 + uStack_3c) break;
    __range1._0_4_ = uStack_3c + (uint)__range1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
    ::operator++(&__end1);
  }
  local_40 = (*ppVar2).first;
  return local_40;
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl: decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}